

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O0

void __thiscall argo::pointer::token::token(token *this,string *name)

{
  string *name_local;
  token *this_local;
  
  this->m_type = object_e;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  this->m_index = 0;
  return;
}

Assistant:

pointer::token::token(const string &name) : m_type(object_e), m_name(name), m_index(0)
{
}